

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrSpatialAnchorsCreateInfoFromUuidsML *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  string *prefix_00;
  PFN_xrStructureTypeToString p_Var1;
  void *value_00;
  XrUuidEXT *pXVar2;
  bool bVar3;
  XrInstance pXVar4;
  ostream *poVar5;
  invalid_argument *piVar6;
  ulong uVar7;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  long local_5f0;
  string uuids_prefix;
  string type_prefix;
  string uuids_array_prefix;
  string uuidcount_prefix;
  string storage_prefix;
  string next_prefix;
  string local_518;
  undefined1 local_4f8 [64];
  string local_4b8;
  ostringstream oss_storage;
  uint auStack_480 [2];
  PFN_xrGetReferenceSpaceBoundsRect local_478;
  PFN_xrCreateActionSpace p_Stack_470;
  PFN_xrLocateSpace local_468;
  PFN_xrDestroySpace p_Stack_460;
  ostringstream oss_uuids_array;
  uint auStack_308 [88];
  ostringstream oss_uuidCount;
  
  PointerToHexString<XrSpatialAnchorsCreateInfoFromUuidsML>(value);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_storage);
  std::__cxx11::string::~string((string *)&oss_storage);
  std::__cxx11::string::append((char *)prefix);
  std::__cxx11::string::string((string *)&type_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&type_prefix);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    std::__cxx11::to_string((string *)&oss_storage,value->type);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_storage);
    std::__cxx11::string::~string((string *)&oss_storage);
  }
  else {
    local_468 = (PFN_xrLocateSpace)0x0;
    p_Stack_460 = (PFN_xrDestroySpace)0x0;
    local_478 = (PFN_xrGetReferenceSpaceBoundsRect)0x0;
    p_Stack_470 = (PFN_xrCreateActionSpace)0x0;
    auStack_480[0] = 0;
    auStack_480[1] = 0;
    _oss_storage = (pointer)0x0;
    p_Var1 = gen_dispatch_table->StructureTypeToString;
    pXVar4 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var1)(pXVar4,value->type,(char *)&oss_storage);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&type_prefix,(char (*) [64])&oss_storage
              );
  }
  std::__cxx11::string::string((string *)&next_prefix,(string *)prefix);
  std::__cxx11::string::append((char *)&next_prefix);
  value_00 = value->next;
  std::__cxx11::string::string((string *)&local_518,(string *)&next_prefix);
  bVar3 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_518,contents);
  std::__cxx11::string::~string((string *)&local_518);
  if (bVar3) {
    std::__cxx11::string::string((string *)&storage_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&storage_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_storage);
    *(uint *)((long)auStack_480 + *(long *)(_oss_storage + -0x18)) =
         *(uint *)((long)auStack_480 + *(long *)(_oss_storage + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_storage);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[26],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [26])"XrSpatialAnchorsStorageML",&storage_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_uuidCount);
    std::__cxx11::string::~string((string *)&oss_uuidCount);
    std::__cxx11::string::string((string *)&uuidcount_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&uuidcount_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_uuidCount);
    poVar5 = std::operator<<((ostream *)&oss_uuidCount,"0x");
    *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) =
         *(uint *)(poVar5 + *(long *)(*(long *)poVar5 + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [9])"uint32_t",&uuidcount_prefix,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss_uuids_array
              );
    std::__cxx11::string::~string((string *)&oss_uuids_array);
    std::__cxx11::string::string((string *)&uuids_prefix,(string *)prefix);
    std::__cxx11::string::append((char *)&uuids_prefix);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_uuids_array);
    *(uint *)((long)auStack_308 + *(long *)(_oss_uuids_array + -0x18)) =
         *(uint *)((long)auStack_308 + *(long *)(_oss_uuids_array + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_uuids_array);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[17],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [17])"const XrUuidEXT*",&uuids_prefix,&uuids_array_prefix);
    std::__cxx11::string::~string((string *)&uuids_array_prefix);
    local_5f0 = 0;
    prefix_00 = (string *)(local_4f8 + 0x20);
    uVar7 = 0;
    while( true ) {
      if (value->uuidCount <= uVar7) {
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_uuids_array);
        std::__cxx11::string::~string((string *)&uuids_prefix);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_uuidCount);
        std::__cxx11::string::~string((string *)&uuidcount_prefix);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_storage);
        std::__cxx11::string::~string((string *)&storage_prefix);
        std::__cxx11::string::~string((string *)&next_prefix);
        std::__cxx11::string::~string((string *)&type_prefix);
        return true;
      }
      std::__cxx11::string::string((string *)&uuids_array_prefix,(string *)&uuids_prefix);
      std::__cxx11::string::append((char *)&uuids_array_prefix);
      std::__cxx11::to_string(&local_4b8,(uint)uVar7);
      std::__cxx11::string::append((string *)&uuids_array_prefix);
      std::__cxx11::string::~string((string *)&local_4b8);
      std::__cxx11::string::append((char *)&uuids_array_prefix);
      pXVar2 = value->uuids;
      std::__cxx11::string::string((string *)prefix_00,(string *)&uuids_array_prefix);
      gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_4f8;
      std::__cxx11::string::string((string *)local_4f8,"const XrUuidEXT*",(allocator *)&local_4b8);
      bVar3 = ApiDumpOutputXrStruct
                        (gen_dispatch_table_00,(XrUuid *)(pXVar2->data + local_5f0),prefix_00,
                         (string *)local_4f8,false,contents);
      std::__cxx11::string::~string((string *)local_4f8);
      std::__cxx11::string::~string((string *)prefix_00);
      if (!bVar3) break;
      std::__cxx11::string::~string((string *)&uuids_array_prefix);
      uVar7 = uVar7 + 1;
      local_5f0 = local_5f0 + 0x10;
    }
    piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar6,"Invalid Operation");
    __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar6 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar6,"Invalid Operation");
  __cxa_throw(piVar6,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSpatialAnchorsCreateInfoFromUuidsML* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string storage_prefix = prefix;
        storage_prefix += "storage";
        std::ostringstream oss_storage;
        oss_storage << std::hex << reinterpret_cast<const void*>(value->storage);
        contents.emplace_back("XrSpatialAnchorsStorageML", storage_prefix, oss_storage.str());
        std::string uuidcount_prefix = prefix;
        uuidcount_prefix += "uuidCount";
        std::ostringstream oss_uuidCount;
        oss_uuidCount << "0x" << std::hex << (value->uuidCount);
        contents.emplace_back("uint32_t", uuidcount_prefix, oss_uuidCount.str());
        std::string uuids_prefix = prefix;
        uuids_prefix += "uuids";
        std::ostringstream oss_uuids_array;
        oss_uuids_array << std::hex << reinterpret_cast<const void*>(value->uuids);
        contents.emplace_back("const XrUuidEXT*", uuids_prefix, oss_uuids_array.str());
        for (uint32_t value_uuids_inc = 0; value_uuids_inc < value->uuidCount; ++value_uuids_inc) {
            std::string uuids_array_prefix = uuids_prefix;
            uuids_array_prefix += "[";
            uuids_array_prefix += std::to_string(value_uuids_inc);
            uuids_array_prefix += "]";
            if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->uuids[value_uuids_inc], uuids_array_prefix, "const XrUuidEXT*", false, contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
        }
        return true;
    } catch(...) {
    }
    return false;
}